

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int luaopen_base(lua_State *L)

{
  GCtab *t;
  GCstr *pGVar1;
  TValue *pTVar2;
  GCtab *t_00;
  
  t = (GCtab *)(L->env).gcptr64;
  pGVar1 = lj_str_new(L,"_G",2);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->u64 = (ulong)t | 0xfffa000000000000;
  lua_pushlstring(L,"Lua 5.1",7);
  t_00 = lj_tab_new(L,0,1);
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  pTVar2->u64 = (ulong)t_00 | 0xfffa000000000000;
  (t_00->metatable).gcptr64 = (uint64_t)t_00;
  pGVar1 = lj_str_new(L,"__mode",6);
  pTVar2 = lj_tab_setstr(L,t_00,pGVar1);
  pGVar1 = lj_str_new(L,"kv",2);
  pTVar2->u64 = (ulong)pGVar1 | 0xfffd800000000000;
  t_00->nomm = 0xf7;
  lj_lib_register(L,"_G","\x02",lj_lib_cf_base);
  lj_lib_register(L,"coroutine",lj_lib_init_coroutine,lj_lib_cf_coroutine);
  lj_lib_prereg(L,"thread.exdata",luaopen_thread_exdata,t);
  lj_lib_prereg(L,"thread.exdata2",luaopen_thread_exdata2,t);
  return 2;
}

Assistant:

LUALIB_API int luaopen_base(lua_State *L)
{
  /* NOBARRIER: Table and value are the same. */
  GCtab *env = tabref(L->env);
  settabV(L, lj_tab_setstr(L, env, lj_str_newlit(L, "_G")), env);
  lua_pushliteral(L, LUA_VERSION);  /* top-3. */
  newproxy_weaktable(L);  /* top-2. */
  LJ_LIB_REG(L, "_G", base);
  LJ_LIB_REG(L, LUA_COLIBNAME, coroutine);

#if LJ_HASFFI
  lj_lib_prereg(L, LUA_THRLIBNAME ".exdata", luaopen_thread_exdata, env);
  lj_lib_prereg(L, LUA_THRLIBNAME ".exdata2", luaopen_thread_exdata2, env);
#endif

  return 2;
}